

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O2

bool __thiscall create::Create::isLightBumperCenterRight(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  ostream *poVar3;
  Packet *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  bVar1 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'-');
  if (bVar1) {
    Data::getPacket((Data *)&local_18,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar2 = Packet::getData(local_18);
    bVar1 = SUB41((uVar2 & 8) >> 3,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
    poVar3 = std::operator<<(poVar3,"Light sensors not supported!");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Create::isLightBumperCenterRight() const {
    if (data->isValidPacketID(ID_LIGHT)) {
      return (GET_DATA(ID_LIGHT) & 0x08) != 0;
    }
    else {
      CERR("[create::Create] ", "Light sensors not supported!");
      return false;
    }
  }